

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::Columns(int columns_count,char *id,bool border)

{
  ImGuiWindow *pIVar1;
  byte in_DL;
  int in_EDI;
  ImGuiColumnsFlags flags;
  ImGuiWindow *window;
  ImGuiColumnsFlags in_stack_00000068;
  int in_stack_0000006c;
  char *in_stack_00000070;
  
  pIVar1 = GetCurrentWindow();
  if ((((pIVar1->DC).ColumnsSet == (ImGuiColumnsSet *)0x0) ||
      (((pIVar1->DC).ColumnsSet)->Count != in_EDI)) ||
     (((pIVar1->DC).ColumnsSet)->Flags != (uint)((in_DL & 1) == 0))) {
    if ((pIVar1->DC).ColumnsSet != (ImGuiColumnsSet *)0x0) {
      EndColumns();
    }
    if (in_EDI != 1) {
      BeginColumns(in_stack_00000070,in_stack_0000006c,in_stack_00000068);
    }
  }
  return;
}

Assistant:

void ImGui::Columns(int columns_count, const char* id, bool border)
{
    ImGuiWindow* window = GetCurrentWindow();
    IM_ASSERT(columns_count >= 1);

    ImGuiColumnsFlags flags = (border ? 0 : ImGuiColumnsFlags_NoBorder);
    //flags |= ImGuiColumnsFlags_NoPreserveWidths; // NB: Legacy behavior
    if (window->DC.ColumnsSet != NULL && window->DC.ColumnsSet->Count == columns_count && window->DC.ColumnsSet->Flags == flags)
        return;

    if (window->DC.ColumnsSet != NULL)
        EndColumns();

    if (columns_count != 1)
        BeginColumns(id, columns_count, flags);
}